

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skein.c
# Opt level: O0

int Skein_512_Final_Pad(Skein_512_Ctxt_t *ctx,u08b_t *hashVal)

{
  u08b_t *hashVal_local;
  Skein_512_Ctxt_t *ctx_local;
  
  (ctx->h).T[1] = (ctx->h).T[1] | 0x8000000000000000;
  if ((ctx->h).bCnt < 0x40) {
    memset(ctx->b + (ctx->h).bCnt,0,0x40 - (ctx->h).bCnt);
  }
  Skein_512_Process_Block(ctx,ctx->b,1,(ctx->h).bCnt);
  memcpy(hashVal,ctx->X,0x40);
  return 0;
}

Assistant:

int Skein_512_Final_Pad(Skein_512_Ctxt_t *ctx, u08b_t *hashVal)
{
    Skein_Assert(ctx->h.bCnt <= SKEIN_512_BLOCK_BYTES,SKEIN_FAIL);    /* catch uninitialized context */

    ctx->h.T[1] |= SKEIN_T1_FLAG_FINAL;        /* tag as the final block */
    if (ctx->h.bCnt < SKEIN_512_BLOCK_BYTES)   /* zero pad b[] if necessary */
        memset(&ctx->b[ctx->h.bCnt],0,SKEIN_512_BLOCK_BYTES - ctx->h.bCnt);
    Skein_512_Process_Block(ctx,ctx->b,1,ctx->h.bCnt);    /* process the final block */

    Skein_Put64_LSB_First(hashVal,ctx->X,SKEIN_512_BLOCK_BYTES);   /* "output" the state bytes */

    return SKEIN_SUCCESS;
}